

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_l1.c
# Opt level: O1

int picnic3_l1_sign(picnic3_l1_privatekey_t *sk,uint8_t *message,size_t message_len,
                   uint8_t *signature,size_t *signature_len)

{
  int iVar1;
  picnic_instance_t *instance;
  
  if ((signature_len != (size_t *)0x0 &&
       (signature != (uint8_t *)0x0 && sk != (picnic3_l1_privatekey_t *)0x0)) &&
     (instance = picnic_instance_get(Picnic3_L1), instance != (picnic_instance_t *)0x0)) {
    iVar1 = impl_sign_picnic3(instance,sk->data + 0x22,sk->data,sk->data + 0x11,message,message_len,
                              signature,signature_len);
    return iVar1;
  }
  return -1;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic3_l1_sign(const picnic3_l1_privatekey_t* sk,
                                                const uint8_t* message, size_t message_len,
                                                uint8_t* signature, size_t* signature_len) {
  if (!sk || !signature || !signature_len) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_c  = SK_C(sk);
  const uint8_t* sk_pt = SK_PT(sk);

  return impl_sign_picnic3(instance, sk_pt, sk_sk, sk_c, message, message_len, signature,
                             signature_len);
}